

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void inxbuild(nn_quant *nnq)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  nq_pixel *paiVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  int iVar25;
  undefined1 auVar23 [16];
  
  auVar3 = _DAT_00124da0;
  auVar2 = _DAT_00123050;
  auVar1 = _DAT_00123040;
  uVar18 = (ulong)(uint)nnq->netsize;
  if (nnq->netsize < 1) {
    nnq->netindex[0] = 0x7f;
    lVar6 = 0;
  }
  else {
    piVar5 = nnq->network[1] + 2;
    uVar7 = 1;
    iVar25 = 0;
    iVar19 = 0;
    uVar12 = 0;
    do {
      iVar9 = nnq->network[uVar12][2];
      uVar13 = uVar12 + 1;
      iVar14 = (int)uVar12;
      uVar16 = uVar12 & 0xffffffff;
      iVar24 = iVar9;
      if ((long)uVar13 < (long)(int)uVar18) {
        uVar16 = uVar12 & 0xffffffff;
        uVar11 = uVar7;
        piVar17 = piVar5;
        do {
          if (*piVar17 < iVar24) {
            uVar16 = uVar11 & 0xffffffff;
            iVar24 = *piVar17;
          }
          uVar11 = uVar11 + 1;
          piVar17 = piVar17 + 5;
        } while ((uVar18 & 0xffffffff) != uVar11);
      }
      iVar15 = (int)uVar16;
      if (uVar12 != uVar16) {
        paiVar4 = nnq->network + uVar12;
        auVar20 = *(undefined1 (*) [16])nnq->network[iVar15];
        *(undefined8 *)nnq->network[iVar15] = *(undefined8 *)*paiVar4;
        nnq->network[iVar15][2] = iVar9;
        iVar9 = nnq->network[iVar15][4];
        *(undefined8 *)(nnq->network[iVar15] + 3) = *(undefined8 *)(*paiVar4 + 3);
        *(undefined1 (*) [16])*paiVar4 = auVar20;
        (*paiVar4)[4] = iVar9;
      }
      iVar9 = iVar24 - iVar19;
      if (iVar9 != 0) {
        nnq->netindex[iVar19] = iVar25 + iVar14 >> 1;
        iVar15 = iVar19 + 1;
        iVar19 = iVar24;
        iVar25 = iVar14;
        if (iVar15 < iVar24) {
          uVar10 = iVar9 - 2;
          auVar20._4_4_ = 0;
          auVar20._0_4_ = uVar10;
          auVar20._8_4_ = uVar10;
          auVar20._12_4_ = 0;
          auVar20 = auVar20 ^ auVar2;
          uVar18 = 0;
          do {
            auVar21._8_4_ = (int)uVar18;
            auVar21._0_8_ = uVar18;
            auVar21._12_4_ = (int)(uVar18 >> 0x20);
            auVar23 = (auVar21 | auVar1) ^ auVar2;
            iVar9 = auVar20._4_4_;
            if ((bool)(~(iVar9 < auVar23._4_4_ ||
                        auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar9) & 1)) {
              nnq->netindex[(long)iVar15 + uVar18] = iVar14;
            }
            if (auVar23._12_4_ <= auVar20._12_4_ &&
                (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
              nnq->netindex[(long)iVar15 + uVar18 + 1] = iVar14;
            }
            auVar21 = (auVar21 | auVar3) ^ auVar2;
            iVar24 = auVar21._4_4_;
            if (iVar24 <= iVar9 && (iVar24 != iVar9 || auVar21._0_4_ <= auVar20._0_4_)) {
              nnq->netindex[(long)iVar15 + uVar18 + 2] = iVar14;
              nnq->netindex[(long)iVar15 + uVar18 + 3] = iVar14;
            }
            uVar18 = uVar18 + 4;
          } while (((ulong)uVar10 + 4 & 0xfffffffffffffffc) != uVar18);
        }
      }
      uVar18 = (ulong)nnq->netsize;
      uVar7 = uVar7 + 1;
      piVar5 = piVar5 + 5;
      uVar12 = uVar13;
    } while ((long)uVar13 < (long)uVar18);
    lVar6 = (long)iVar19;
    nnq->netindex[lVar6] = iVar25 + 0xff >> 1;
    if (0xfe < iVar19) {
      return;
    }
  }
  auVar3 = _DAT_00124da0;
  auVar2 = _DAT_00123050;
  auVar1 = _DAT_00123040;
  lVar8 = 0xfe - lVar6;
  auVar23._8_4_ = (int)lVar8;
  auVar23._0_8_ = lVar8;
  auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
  uVar18 = 0;
  auVar23 = auVar23 ^ _DAT_00123050;
  do {
    auVar22._8_4_ = (int)uVar18;
    auVar22._0_8_ = uVar18;
    auVar22._12_4_ = (int)(uVar18 >> 0x20);
    auVar20 = (auVar22 | auVar1) ^ auVar2;
    iVar19 = auVar23._4_4_;
    if ((bool)(~(auVar20._4_4_ == iVar19 && auVar23._0_4_ < auVar20._0_4_ || iVar19 < auVar20._4_4_)
              & 1)) {
      nnq->netindex[lVar6 + uVar18 + 1] = 0xff;
    }
    if ((auVar20._12_4_ != auVar23._12_4_ || auVar20._8_4_ <= auVar23._8_4_) &&
        auVar20._12_4_ <= auVar23._12_4_) {
      nnq->netindex[lVar6 + uVar18 + 2] = 0xff;
    }
    auVar20 = (auVar22 | auVar3) ^ auVar2;
    iVar25 = auVar20._4_4_;
    if (iVar25 <= iVar19 && (iVar25 != iVar19 || auVar20._0_4_ <= auVar23._0_4_)) {
      nnq->netindex[lVar6 + uVar18 + 3] = 0xff;
      nnq->netindex[lVar6 + uVar18 + 4] = 0xff;
    }
    uVar18 = uVar18 + 4;
  } while ((0x102U - lVar6 & 0xfffffffffffffffc) != uVar18);
  return;
}

Assistant:

void inxbuild(nn_quant *nnq)
{
	register int i,j,smallpos,smallval;
	register int *p,*q;
	int previouscol,startpos;

	previouscol = 0;
	startpos = 0;
	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		smallpos = i;
		smallval = p[2];			/* index on g */
		/* find smallest in i..netsize-1 */
		for (j=i+1; j < nnq->netsize; j++) {
			q = nnq->network[j];
			if (q[2] < smallval) {		/* index on g */
				smallpos = j;
				smallval = q[2];	/* index on g */
			}
		}
		q = nnq->network[smallpos];
		/* swap p (i) and q (smallpos) entries */
		if (i != smallpos) {
			j = q[0];
			q[0] = p[0];
			p[0] = j;
			j = q[1];
			q[1] = p[1];
			p[1] = j;
			j = q[2];
			q[2] = p[2];
			p[2] = j;
			j = q[3];
			q[3] = p[3];
			p[3] = j;
			j = q[4];
			q[4] = p[4];
			p[4] = j;
		}
		/* smallval entry is now in position i */
		if (smallval != previouscol) {
			nnq->netindex[previouscol] = (startpos+i)>>1;
			for (j=previouscol+1; j<smallval; j++) nnq->netindex[j] = i;
			previouscol = smallval;
			startpos = i;
		}
	}
	nnq->netindex[previouscol] = (startpos+maxnetpos)>>1;
	for (j=previouscol+1; j<256; j++) nnq->netindex[j] = maxnetpos; /* really 256 */
}